

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O0

char * utf8_range_SkipAscii(char *data,char *end)

{
  bool bVar1;
  char *end_local;
  char *data_local;
  uint64_t t;
  
  end_local = data;
  while( true ) {
    bVar1 = false;
    if (7 < (long)end - (long)end_local) {
      bVar1 = (*(ulong *)end_local & 0x8080808080808080) == 0;
    }
    if (!bVar1) break;
    end_local = end_local + 8;
  }
  while( true ) {
    bVar1 = false;
    if (end_local < end) {
      bVar1 = (byte)*end_local < 0x80;
    }
    if (!bVar1) break;
    end_local = end_local + 1;
  }
  return end_local;
}

Assistant:

static inline const char* utf8_range_SkipAscii(const char* data,
                                               const char* end) {
  while (8 <= end - data &&
         (utf8_range_UnalignedLoad64(data) & 0x8080808080808080) == 0) {
    data += 8;
  }
  while (data < end && utf8_range_AsciiIsAscii(*data)) {
    ++data;
  }
  return data;
}